

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.h
# Opt level: O2

void __thiscall xLearn::FFMScore::~FFMScore(FFMScore *this)

{
  Score::~Score(&this->super_Score);
  operator_delete(this);
  return;
}

Assistant:

~FFMScore() { }